

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  char cVar1;
  cmMakefile *pcVar2;
  OutputFormat output;
  string_view sVar3;
  bool bVar4;
  ulong uVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  undefined1 *puVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool local_802;
  string local_740 [8];
  string flags;
  string includePath;
  string local_6f0;
  _Base_ptr local_6d0;
  undefined1 local_6c8;
  _Base_ptr local_6c0;
  undefined1 local_6b8;
  cmAlphaNum local_6b0;
  cmAlphaNum local_680;
  string local_650;
  undefined1 local_630 [8];
  string frameworkDir;
  string local_608;
  string *local_5e8;
  reference local_5e0;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  undefined1 local_588 [6];
  bool sysIncludeFlagUsed;
  bool flagUsed;
  cmAlphaNum local_558;
  string local_528;
  cmValue local_508;
  cmValue sysFwSearchFlag;
  cmAlphaNum local_4d0;
  string local_4a0;
  cmValue local_480;
  cmValue fwSearchFlag;
  cmAlphaNum local_448;
  string local_418;
  string *local_3f8;
  cmAlphaNum local_3f0;
  cmAlphaNum local_3c0;
  string local_390;
  string *local_370;
  cmValue local_368;
  cmValue sysIncludeFlagWarning;
  cmValue sysIncludeFlag;
  cmAlphaNum local_328;
  string local_2f8;
  cmValue local_2d8;
  cmValue incSep;
  string local_2c8 [6];
  bool repeatFlag;
  string sep;
  string local_2a0;
  cmValue local_280;
  byte local_271;
  undefined1 local_270 [7];
  bool quotePaths;
  cmAlphaNum local_240;
  string local_210;
  string *local_1f0;
  string *includeFlag;
  ostringstream includeFlags;
  undefined1 local_68 [4];
  OutputFormat shellFormat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  allocator<char> local_3a;
  byte local_39;
  string *psStack_38;
  bool forResponseFile_local;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includeDirs_local;
  cmLocalGenerator *this_local;
  
  local_39 = forResponseFile;
  psStack_38 = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)includeDirs;
  includeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)target_local);
    MoveSystemIncludesToEnd
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68,psStack_38,config_local,(cmGeneratorTarget *)lang_local);
    output = (local_39 & 1) * 3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeFlag);
    pcVar2 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_240,"CMAKE_INCLUDE_FLAG_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_270,config_local);
    cmStrCat<>(&local_210,&local_240,(cmAlphaNum *)local_270);
    psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    local_271 = 0;
    pcVar2 = this->Makefile;
    local_1f0 = psVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"CMAKE_QUOTE_INCLUDE_PATHS",
               (allocator<char> *)(sep.field_2._M_local_buf + 0xf));
    local_280 = cmMakefile::GetDefinition(pcVar2,&local_2a0);
    bVar4 = cmValue::operator_cast_to_bool(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)(sep.field_2._M_local_buf + 0xf));
    if (bVar4) {
      local_271 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2c8," ",(allocator<char> *)((long)&incSep.Value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&incSep.Value + 7));
    incSep.Value._6_1_ = 1;
    pcVar2 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_328,"CMAKE_INCLUDE_FLAG_SEP_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sysIncludeFlag,config_local);
    cmStrCat<>(&local_2f8,&local_328,(cmAlphaNum *)&sysIncludeFlag);
    local_2d8 = cmMakefile::GetDefinition(pcVar2,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    bVar4 = cmValue::operator_cast_to_bool(&local_2d8);
    if (bVar4) {
      psVar6 = cmValue::operator_cast_to_string_(&local_2d8);
      std::__cxx11::string::operator=(local_2c8,(string *)psVar6);
      incSep.Value._6_1_ = 0;
    }
    cmValue::cmValue(&sysIncludeFlagWarning,(nullptr_t)0x0);
    cmValue::cmValue(&local_368,(nullptr_t)0x0);
    if ((incSep.Value._6_1_ & 1) != 0) {
      pcVar2 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_3c0,"CMAKE_INCLUDE_SYSTEM_FLAG_");
      cmAlphaNum::cmAlphaNum(&local_3f0,config_local);
      cmStrCat<>(&local_390,&local_3c0,&local_3f0);
      local_370 = (string *)cmMakefile::GetDefinition(pcVar2,&local_390);
      sysIncludeFlagWarning.Value = local_370;
      std::__cxx11::string::~string((string *)&local_390);
      pcVar2 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_448,"_CMAKE_INCLUDE_SYSTEM_FLAG_");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fwSearchFlag,config_local);
      cmStrCat<char[9]>(&local_418,&local_448,(cmAlphaNum *)&fwSearchFlag,(char (*) [9])0xbd8e29);
      local_3f8 = (string *)cmMakefile::GetDefinition(pcVar2,&local_418);
      local_368 = (cmValue)local_3f8;
      std::__cxx11::string::~string((string *)&local_418);
    }
    pcVar2 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_4d0,"CMAKE_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sysFwSearchFlag,config_local);
    cmStrCat<char[23]>(&local_4a0,&local_4d0,(cmAlphaNum *)&sysFwSearchFlag,(char (*) [23])0xbfc357)
    ;
    local_480 = cmMakefile::GetDefinition(pcVar2,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    pcVar2 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_558,"CMAKE_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_588,config_local);
    cmStrCat<char[30]>(&local_528,&local_558,(cmAlphaNum *)local_588,
                       (char (*) [30])"_SYSTEM_FRAMEWORK_SEARCH_FLAG");
    local_508 = cmMakefile::GetDefinition(pcVar2,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar4) {
      local_5e0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      local_5e8 = local_480.Value;
      frameworkDir.field_2._M_local_buf[0xe] = '\0';
      frameworkDir.field_2._M_local_buf[0xd] = '\0';
      bVar4 = cmNonempty(local_480);
      local_802 = false;
      if (bVar4) {
        pcVar2 = this->Makefile;
        std::allocator<char>::allocator();
        frameworkDir.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_608,"APPLE",
                   (allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
        frameworkDir.field_2._M_local_buf[0xd] = '\x01';
        bVar4 = cmMakefile::IsOn(pcVar2,&local_608);
        local_802 = false;
        if (bVar4) {
          local_802 = cmSystemTools::IsPathToFramework(local_5e0);
        }
      }
      if ((frameworkDir.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_608);
      }
      if ((frameworkDir.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
      }
      if (local_802 == false) {
        if (((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) ||
           ((incSep.Value._6_1_ & 1) != 0)) {
          bVar4 = cmValue::operator_cast_to_bool(&sysIncludeFlagWarning);
          if ((bVar4) &&
             ((lang_local != (string *)0x0 &&
              (bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 ((cmGeneratorTarget *)lang_local,local_5e0,psStack_38,config_local)
              , bVar4)))) {
            psVar6 = cmValue::operator*[abi_cxx11_(&sysIncludeFlagWarning);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
            emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
          }
          else {
            std::operator<<((ostream *)&includeFlag,(string *)local_1f0);
          }
          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
        (*this->_vptr_cmLocalGenerator[0x11])
                  ((undefined1 *)((long)&flags.field_2 + 8),this,local_5e0,(ulong)output);
        if ((((local_271 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar8 = (char *)std::__cxx11::string::front(), *pcVar8 != '\"')) {
          std::operator<<((ostream *)&includeFlag,"\"");
        }
        std::operator<<((ostream *)&includeFlag,(string *)(flags.field_2._M_local_buf + 8));
        if ((((local_271 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
           (pcVar8 = (char *)std::__cxx11::string::front(), *pcVar8 != '\"')) {
          std::operator<<((ostream *)&includeFlag,"\"");
        }
        std::operator<<((ostream *)&includeFlag,local_2c8);
        std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_680,local_5e0);
        cmAlphaNum::cmAlphaNum(&local_6b0,"/../");
        cmStrCat<>(&local_650,&local_680,&local_6b0);
        cmsys::SystemTools::CollapseFullPath((string *)local_630,&local_650);
        std::__cxx11::string::~string((string *)&local_650);
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1,(value_type *)local_630);
        local_6d0 = (_Base_ptr)pVar10.first._M_node;
        local_6c8 = pVar10.second;
        local_6c0 = local_6d0;
        local_6b8 = local_6c8;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bVar4 = cmValue::operator_cast_to_bool(&local_508);
          if (((bVar4) && (lang_local != (string *)0x0)) &&
             (bVar4 = cmGeneratorTarget::IsSystemIncludeDirectory
                                ((cmGeneratorTarget *)lang_local,local_5e0,psStack_38,config_local),
             bVar4)) {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_508);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
          }
          else {
            psVar6 = cmValue::operator*[abi_cxx11_(&local_480);
            std::operator<<((ostream *)&includeFlag,(string *)psVar6);
          }
          sVar3 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_630);
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_6f0,&this->super_cmOutputConverter,sVar3,output);
          poVar7 = std::operator<<((ostream *)&includeFlag,(string *)&local_6f0);
          std::operator<<(poVar7," ");
          std::__cxx11::string::~string((string *)&local_6f0);
        }
        std::__cxx11::string::~string((string *)local_630);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    if (((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) &&
       (bVar4 = cmValue::operator_cast_to_bool(&local_368), bVar4)) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_368);
      std::operator<<((ostream *)&includeFlag,(string *)psVar6);
    }
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_2c8);
    if ((*pcVar8 != ' ') && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      pcVar8 = (char *)std::__cxx11::string::back();
      cVar1 = *pcVar8;
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_2c8);
      if (cVar1 == *pcVar8) {
        puVar9 = (undefined1 *)std::__cxx11::string::back();
        *puVar9 = 0x20;
      }
    }
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_740);
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,sVar3);
    std::__cxx11::string::~string(local_740);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeFlag);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_3a);
    std::allocator<char>::~allocator(&local_3a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir =
        cmSystemTools::CollapseFullPath(cmStrCat(i, "/../"));
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}